

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substring.c
# Opt level: O0

int pcre2_substring_get_bynumber_16
              (pcre2_match_data_16 *match_data,uint32_t stringnumber,PCRE2_UCHAR16 **stringptr,
              size_t *sizeptr)

{
  void *pvVar1;
  PCRE2_UCHAR16 *yield;
  size_t size;
  size_t *psStack_30;
  int rc;
  size_t *sizeptr_local;
  PCRE2_UCHAR16 **stringptr_local;
  pcre2_match_data_16 *ppStack_18;
  uint32_t stringnumber_local;
  pcre2_match_data_16 *match_data_local;
  
  psStack_30 = sizeptr;
  sizeptr_local = (size_t *)stringptr;
  stringptr_local._4_4_ = stringnumber;
  ppStack_18 = match_data;
  size._4_4_ = pcre2_substring_length_bynumber_16(match_data,stringnumber,(size_t *)&yield);
  match_data_local._4_4_ = size._4_4_;
  if (-1 < size._4_4_) {
    pvVar1 = _pcre2_memctl_malloc_16(((long)yield + 1) * 0x10 + 0x18,&ppStack_18->memctl);
    if (pvVar1 == (void *)0x0) {
      match_data_local._4_4_ = -0x30;
    }
    else {
      pvVar1 = (void *)((long)pvVar1 + 0x18);
      memcpy(pvVar1,ppStack_18->subject + ppStack_18->ovector[stringptr_local._4_4_ << 1],
             (long)yield << 1);
      *(undefined2 *)((long)pvVar1 + (long)yield * 2) = 0;
      *sizeptr_local = (size_t)pvVar1;
      *psStack_30 = (size_t)yield;
      match_data_local._4_4_ = 0;
    }
  }
  return match_data_local._4_4_;
}

Assistant:

PCRE2_CALL_CONVENTION
pcre2_substring_get_bynumber(pcre2_match_data *match_data,
  uint32_t stringnumber, PCRE2_UCHAR **stringptr, PCRE2_SIZE *sizeptr)
{
int rc;
PCRE2_SIZE size;
PCRE2_UCHAR *yield;
rc = pcre2_substring_length_bynumber(match_data, stringnumber, &size);
if (rc < 0) return rc;
yield = PRIV(memctl_malloc)(sizeof(pcre2_memctl) +
  (size + 1)*PCRE2_CODE_UNIT_WIDTH, (pcre2_memctl *)match_data);
if (yield == NULL) return PCRE2_ERROR_NOMEMORY;
yield = (PCRE2_UCHAR *)(((char *)yield) + sizeof(pcre2_memctl));
memcpy(yield, match_data->subject + match_data->ovector[stringnumber*2],
  CU2BYTES(size));
yield[size] = 0;
*stringptr = yield;
*sizeptr = size;
return 0;
}